

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdWritePrime(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  int iVar;
  int iVar2;
  char local_a18 [4];
  int nNonDecSize;
  char pRes [2000];
  int vBest;
  int nWords;
  word pCofTemp [64];
  int local_2c;
  int local_28;
  int RetValue;
  int v;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  Dau_Dsd_t *p_local;
  
  local_2c = 2;
  if (nVars < 3) {
    __assert_fail("nVars > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                  ,0x414,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
  }
  if (p->fSplitPrime == 0) {
    if (p->fWriteTruth != 0) {
      iVar1 = Abc_TtWriteHexRev(p->pOutput + p->nPos,pTruth,nVars);
      p->nPos = iVar1 + p->nPos;
    }
  }
  else {
    iVar1 = Abc_TtWordNum(nVars);
    iVar = Dau_DsdCheck1Step(p,pTruth,nVars,p->pVarLevels);
    if (iVar == -1) {
      __assert_fail("vBest != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                    ,0x41a,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
    }
    if (iVar == -2) {
      iVar1 = Abc_TtWriteHexRev(p->pOutput + p->nPos,pTruth,nVars);
      p->nPos = iVar1 + p->nPos;
    }
    else {
      Dau_DsdWriteString(p,"<");
      Dau_DsdWriteVar(p,iVar,0);
      Abc_TtCofactor1p((word *)&vBest,pTruth,iVar1,iVar);
      iVar2 = Dau_DsdDecompose((word *)&vBest,nVars,0,p->fWriteTruth,local_a18);
      if (iVar2 != 0) {
        __assert_fail("nNonDecSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                      ,0x427,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      Dau_DsdWriteString(p,local_a18);
      Abc_TtCofactor0p((word *)&vBest,pTruth,iVar1,iVar);
      iVar1 = Dau_DsdDecompose((word *)&vBest,nVars,0,p->fWriteTruth,local_a18);
      if (iVar1 != 0) {
        __assert_fail("nNonDecSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                      ,0x42c,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      Dau_DsdWriteString(p,local_a18);
      Dau_DsdWriteString(p,">");
      local_2c = 1;
    }
  }
  Dau_DsdWriteString(p,"{");
  for (local_28 = 0; local_28 < nVars; local_28 = local_28 + 1) {
    Dau_DsdWriteVar(p,pVars[local_28],0);
  }
  Dau_DsdWriteString(p,"}");
  p->nSizeNonDec = nVars;
  return local_2c;
}

Assistant:

static inline int Dau_DsdWritePrime( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars )
{
    int v, RetValue = 2;
    assert( nVars > 2 );
    if ( p->fSplitPrime )
    {
        word pCofTemp[DAU_MAX_WORD];
        int nWords = Abc_TtWordNum(nVars);
        int vBest = Dau_DsdCheck1Step( p, pTruth, nVars, p->pVarLevels );
        assert( vBest != -1 );
        if ( vBest == -2 ) // non-dec
            p->nPos += Abc_TtWriteHexRev( p->pOutput + p->nPos, pTruth, nVars );
        else 
        {
            char pRes[DAU_MAX_STR];
            int nNonDecSize;
            // compose the result
            Dau_DsdWriteString( p, "<" );
            Dau_DsdWriteVar( p, vBest, 0 );
            // split decomposition
            Abc_TtCofactor1p( pCofTemp, pTruth, nWords, vBest );
            nNonDecSize = Dau_DsdDecompose( pCofTemp, nVars, 0, p->fWriteTruth, pRes );
            assert( nNonDecSize == 0 );
            Dau_DsdWriteString( p, pRes );
            // split decomposition
            Abc_TtCofactor0p( pCofTemp, pTruth, nWords, vBest );
            nNonDecSize = Dau_DsdDecompose( pCofTemp, nVars, 0, p->fWriteTruth, pRes );
            assert( nNonDecSize == 0 );
            Dau_DsdWriteString( p, pRes );
            Dau_DsdWriteString( p, ">" );
            RetValue = 1;
        }
    }
    else if ( p->fWriteTruth )
        p->nPos += Abc_TtWriteHexRev( p->pOutput + p->nPos, pTruth, nVars );
    Dau_DsdWriteString( p, "{" );
    for ( v = 0; v < nVars; v++ )
        Dau_DsdWriteVar( p, pVars[v], 0 );
    Dau_DsdWriteString( p, "}" );
    p->nSizeNonDec = nVars;
    return RetValue;
}